

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::ConfidentialTransaction
          (ConfidentialTransaction *this,ConfidentialTransaction *transaction)

{
  string local_30;
  
  AbstractTransaction::GetHex_abi_cxx11_(&local_30,&transaction->super_AbstractTransaction);
  ConfidentialTransaction(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ConfidentialTransaction::ConfidentialTransaction(
    const ConfidentialTransaction &transaction)
    : ConfidentialTransaction(transaction.GetHex()) {
  // copy constructor
}